

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O0

void __thiscall
Eigen::internal::CompressedStorage<float,_int>::reallocate
          (CompressedStorage<float,_int> *this,Index size)

{
  long lVar1;
  float *start;
  int *start_00;
  long *plVar2;
  float **ppfVar3;
  int **ppiVar4;
  Index copySize;
  scoped_array<int> local_28;
  scoped_array<int> newIndices;
  scoped_array<float> newValues;
  Index size_local;
  CompressedStorage<float,_int> *this_local;
  
  newValues.m_ptr = (float *)size;
  scoped_array<float>::scoped_array((scoped_array<float> *)&newIndices,size);
  scoped_array<int>::scoped_array(&local_28,(ptrdiff_t)newValues.m_ptr);
  plVar2 = std::min<long>((long *)&newValues,&this->m_size);
  lVar1 = *plVar2;
  if (0 < lVar1) {
    start = this->m_values;
    ppfVar3 = scoped_array<float>::ptr((scoped_array<float> *)&newIndices);
    smart_copy<float>(start,start + lVar1,*ppfVar3);
    start_00 = this->m_indices;
    ppiVar4 = scoped_array<int>::ptr(&local_28);
    smart_copy<int>(start_00,start_00 + lVar1,*ppiVar4);
  }
  ppfVar3 = scoped_array<float>::ptr((scoped_array<float> *)&newIndices);
  std::swap<float*>(&this->m_values,ppfVar3);
  ppiVar4 = scoped_array<int>::ptr(&local_28);
  std::swap<int*>(&this->m_indices,ppiVar4);
  this->m_allocatedSize = (Index)newValues.m_ptr;
  scoped_array<int>::~scoped_array(&local_28);
  scoped_array<float>::~scoped_array((scoped_array<float> *)&newIndices);
  return;
}

Assistant:

inline void reallocate(Index size)
    {
      #ifdef EIGEN_SPARSE_COMPRESSED_STORAGE_REALLOCATE_PLUGIN
        EIGEN_SPARSE_COMPRESSED_STORAGE_REALLOCATE_PLUGIN
      #endif
      eigen_internal_assert(size!=m_allocatedSize);
      internal::scoped_array<Scalar> newValues(size);
      internal::scoped_array<StorageIndex> newIndices(size);
      Index copySize = (std::min)(size, m_size);
      if (copySize>0) {
        internal::smart_copy(m_values, m_values+copySize, newValues.ptr());
        internal::smart_copy(m_indices, m_indices+copySize, newIndices.ptr());
      }
      std::swap(m_values,newValues.ptr());
      std::swap(m_indices,newIndices.ptr());
      m_allocatedSize = size;
    }